

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstrum_to_mel_generalized_cepstrum.h
# Opt level: O0

void __thiscall
sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::
~MelGeneralizedCepstrumToMelGeneralizedCepstrum
          (MelGeneralizedCepstrumToMelGeneralizedCepstrum *this)

{
  void *in_RDI;
  MelGeneralizedCepstrumToMelGeneralizedCepstrum *unaff_retaddr;
  
  ~MelGeneralizedCepstrumToMelGeneralizedCepstrum(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~MelGeneralizedCepstrumToMelGeneralizedCepstrum() {
    for (std::vector<MelGeneralizedCepstrumToMelGeneralizedCepstrum::
                         ModuleInterface*>::iterator itr(modules_.begin());
         itr != modules_.end(); ++itr) {
      delete (*itr);
    }
  }